

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int vdbeColumnFromOverflow
              (VdbeCursor *pC,int iCol,int t,i64 iOffset,u32 cacheStatus,u32 colCacheCtr,Mem *pDest)

{
  long lVar1;
  uint uVar2;
  u32 uVar3;
  int iVar4;
  void *pvVar5;
  Mem *pMVar6;
  BtCursor *pCur;
  i64 iVar7;
  undefined8 in_RCX;
  u32 in_EDX;
  int in_ESI;
  char *in_RDI;
  int in_R8D;
  int in_R9D;
  char *pBuf;
  VdbeTxtBlbCache *pCache;
  int len;
  int encoding;
  sqlite3 *db;
  int rc;
  Mem *in_stack_ffffffffffffffa8;
  Mem *in_stack_ffffffffffffffb0;
  undefined1 *z;
  BtCursor *in_stack_ffffffffffffffb8;
  long *plVar8;
  int local_2c;
  u8 enc;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  enc = (u8)((ulong)in_RCX >> 0x38);
  lVar1 = *(long *)(pBuf + 0x18);
  uVar2 = (uint)(byte)pBuf[0x16];
  uVar3 = sqlite3VdbeSerialTypeLen(in_EDX);
  if (*(int *)(lVar1 + 0x88) < (int)uVar3) {
    return 0x12;
  }
  if (((int)uVar3 < 0xfa1) || (*(long *)(in_RDI + 0x30) != 0)) {
    iVar4 = sqlite3VdbeMemFromBtree
                      (in_stack_ffffffffffffffb8,(u32)((ulong)in_stack_ffffffffffffffb0 >> 0x20),
                       (u32)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    if (iVar4 != 0) {
      return iVar4;
    }
    sqlite3VdbeSerialGet
              ((uchar *)CONCAT44(uVar2,uVar3),(u32)((ulong)in_stack_ffffffffffffffb8 >> 0x20),
               in_stack_ffffffffffffffb0);
    local_2c = 0;
    if (((in_EDX & 1) != 0) && (uVar2 == 1)) {
      *(undefined1 *)(*(long *)(pBuf + 8) + (long)(int)uVar3) = 0;
      *(ushort *)(pBuf + 0x14) = *(ushort *)(pBuf + 0x14) | 0x200;
    }
    goto LAB_00185242;
  }
  z = &DAT_aaaaaaaaaaaaaaaa;
  if (((byte)in_RDI[5] >> 4 & 1) == 0) {
    pvVar5 = sqlite3DbMallocZero((sqlite3 *)&DAT_aaaaaaaaaaaaaaaa,(u64)in_stack_ffffffffffffffa8);
    *(void **)(in_RDI + 0x68) = pvVar5;
    if (*(long *)(in_RDI + 0x68) == 0) {
      return 7;
    }
    in_RDI[5] = in_RDI[5] & 0xefU | 0x10;
  }
  plVar8 = *(long **)(in_RDI + 0x68);
  if ((((*plVar8 == 0) || ((int)plVar8[2] != in_ESI)) || (*(int *)((long)plVar8 + 0x14) != in_R8D))
     || ((int)plVar8[3] != in_R9D)) {
LAB_00185047:
    if (*plVar8 != 0) {
      sqlite3RCStrUnref(z);
    }
    pCur = (BtCursor *)sqlite3RCStrNew((u64)in_stack_ffffffffffffffa8);
    *plVar8 = (long)pCur;
    if (pCur == (BtCursor *)0x0) {
      return 7;
    }
    iVar4 = sqlite3BtreePayload(pCur,(u32)((ulong)in_stack_ffffffffffffffa8 >> 0x20),
                                (u32)in_stack_ffffffffffffffa8,(void *)0x1850ae);
    if (iVar4 != 0) {
      return iVar4;
    }
    *(undefined1 *)((long)pCur->aiIdx + (long)(int)uVar3 + -0x58) = 0;
    *(undefined1 *)((long)pCur->aiIdx + (long)(int)(uVar3 + 1) + -0x58) = 0;
    *(undefined1 *)((long)pCur->aiIdx + (long)(int)(uVar3 + 2) + -0x58) = 0;
    *(int *)(plVar8 + 2) = in_ESI;
    *(int *)((long)plVar8 + 0x14) = in_R8D;
    *(int *)(plVar8 + 3) = in_R9D;
    iVar7 = sqlite3BtreeOffset((BtCursor *)0x18512c);
    plVar8[1] = iVar7;
  }
  else {
    in_stack_ffffffffffffffa8 = (Mem *)plVar8[1];
    pMVar6 = (Mem *)sqlite3BtreeOffset((BtCursor *)0x185037);
    if (in_stack_ffffffffffffffa8 != pMVar6) goto LAB_00185047;
    pCur = (BtCursor *)*plVar8;
  }
  sqlite3RCStrRef((char *)pCur);
  if ((in_EDX & 1) == 0) {
    local_2c = sqlite3VdbeMemSetStr
                         ((Mem *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                          in_RDI,CONCAT44(in_ESI,in_EDX),enc,
                          (_func_void_void_ptr *)CONCAT44(in_R8D,in_R9D));
  }
  else {
    local_2c = sqlite3VdbeMemSetStr
                         ((Mem *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                          in_RDI,CONCAT44(in_ESI,in_EDX),enc,
                          (_func_void_void_ptr *)CONCAT44(in_R8D,in_R9D));
    *(ushort *)(pBuf + 0x14) = *(ushort *)(pBuf + 0x14) | 0x200;
  }
LAB_00185242:
  *(ushort *)(pBuf + 0x14) = *(ushort *)(pBuf + 0x14) & 0xbfff;
  return local_2c;
}

Assistant:

static SQLITE_NOINLINE int vdbeColumnFromOverflow(
  VdbeCursor *pC,       /* The BTree cursor from which we are reading */
  int iCol,             /* The column to read */
  int t,                /* The serial-type code for the column value */
  i64 iOffset,          /* Offset to the start of the content value */
  u32 cacheStatus,      /* Current Vdbe.cacheCtr value */
  u32 colCacheCtr,      /* Current value of the column cache counter */
  Mem *pDest            /* Store the value into this register. */
){
  int rc;
  sqlite3 *db = pDest->db;
  int encoding = pDest->enc;
  int len = sqlite3VdbeSerialTypeLen(t);
  assert( pC->eCurType==CURTYPE_BTREE );
  if( len>db->aLimit[SQLITE_LIMIT_LENGTH] ) return SQLITE_TOOBIG;
  if( len > 4000 && pC->pKeyInfo==0 ){
    /* Cache large column values that are on overflow pages using
    ** an RCStr (reference counted string) so that if they are reloaded,
    ** that do not have to be copied a second time.  The overhead of
    ** creating and managing the cache is such that this is only
    ** profitable for larger TEXT and BLOB values.
    **
    ** Only do this on table-btrees so that writes to index-btrees do not
    ** need to clear the cache.  This buys performance in the common case
    ** in exchange for generality.
    */
    VdbeTxtBlbCache *pCache;
    char *pBuf;
    if( pC->colCache==0 ){
      pC->pCache = sqlite3DbMallocZero(db, sizeof(VdbeTxtBlbCache) );
      if( pC->pCache==0 ) return SQLITE_NOMEM;
      pC->colCache = 1;
    }
    pCache = pC->pCache;
    if( pCache->pCValue==0
     || pCache->iCol!=iCol
     || pCache->cacheStatus!=cacheStatus
     || pCache->colCacheCtr!=colCacheCtr
     || pCache->iOffset!=sqlite3BtreeOffset(pC->uc.pCursor)
    ){
      if( pCache->pCValue ) sqlite3RCStrUnref(pCache->pCValue);
      pBuf = pCache->pCValue = sqlite3RCStrNew( len+3 );
      if( pBuf==0 ) return SQLITE_NOMEM;
      rc = sqlite3BtreePayload(pC->uc.pCursor, iOffset, len, pBuf);
      if( rc ) return rc;
      pBuf[len] = 0;
      pBuf[len+1] = 0;
      pBuf[len+2] = 0;
      pCache->iCol = iCol;
      pCache->cacheStatus = cacheStatus;
      pCache->colCacheCtr = colCacheCtr;
      pCache->iOffset = sqlite3BtreeOffset(pC->uc.pCursor);
    }else{
      pBuf = pCache->pCValue;
    }
    assert( t>=12 );
    sqlite3RCStrRef(pBuf);
    if( t&1 ){
      rc = sqlite3VdbeMemSetStr(pDest, pBuf, len, encoding,
                                sqlite3RCStrUnref);
      pDest->flags |= MEM_Term;
    }else{
      rc = sqlite3VdbeMemSetStr(pDest, pBuf, len, 0,
                                sqlite3RCStrUnref);
    }
  }else{
    rc = sqlite3VdbeMemFromBtree(pC->uc.pCursor, iOffset, len, pDest);
    if( rc ) return rc;
    sqlite3VdbeSerialGet((const u8*)pDest->z, t, pDest);
    if( (t&1)!=0 && encoding==SQLITE_UTF8 ){
      pDest->z[len] = 0;
      pDest->flags |= MEM_Term;
    }
  }
  pDest->flags &= ~MEM_Ephem;
  return rc;
}